

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::printDisplayLine(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,bool force,bool forceHead)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar2;
  SPxOut *pSVar3;
  ostream *poVar4;
  long lVar5;
  ostream *poVar6;
  undefined8 uVar7;
  long lVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  cpp_dec_float<50U,_int,_void> *pcVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  Verbosity local_23c;
  cpp_dec_float<50U,_int,_void> local_238;
  cpp_dec_float<50U,_int,_void> local_1f8;
  cpp_dec_float<50U,_int,_void> local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_180;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  pSVar3 = this->spxout;
  if (pSVar3 == (SPxOut *)0x0) {
    return;
  }
  local_23c = pSVar3->m_verbosity;
  if ((int)local_23c < 3) {
    return;
  }
  local_1b8.data._M_elems[0] = 3;
  (*pSVar3->_vptr_SPxOut[2])();
  if (forceHead) {
LAB_002347a4:
    std::__ostream_insert<char,std::char_traits<char>>
              (this->spxout->m_streams[this->spxout->m_verbosity],
               "type |   time |   iters | facts |    shift | viol sum | viol num | obj value ",0x4d)
    ;
    if (-1 < this->printBasisMetric) {
      std::__ostream_insert<char,std::char_traits<char>>
                (this->spxout->m_streams[this->spxout->m_verbosity]," | basis metric",0xf);
    }
    poVar4 = this->spxout->m_streams[this->spxout->m_verbosity];
    cVar9 = (char)poVar4;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar9);
    std::ostream::put(cVar9);
    std::ostream::flush();
    if (force) {
      if (forceHead) goto LAB_00234ed7;
    }
    else {
      iVar10 = this->displayLine;
      iVar11 = this->displayFreq;
LAB_00234847:
      if (iVar10 % iVar11 != 0 || forceHead) goto LAB_00234ed7;
    }
  }
  else {
    iVar10 = this->displayLine;
    iVar11 = this->displayFreq;
    if (iVar10 % (iVar11 * 0x1e) == 0) goto LAB_002347a4;
    if (!force) goto LAB_00234847;
  }
  pcVar12 = "  E  |";
  if (this->theType == LEAVE) {
    pcVar12 = "  L  |";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (this->spxout->m_streams[this->spxout->m_verbosity],pcVar12,6);
  pSVar3 = this->spxout;
  poVar4 = pSVar3->m_streams[pSVar3->m_verbosity];
  lVar5 = *(long *)poVar4;
  *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) =
       *(uint *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x18) & 0xfffffefb | 4;
  *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 0x10) = 7;
  *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 8) = 1;
  (*this->theTime->_vptr_Timer[6])();
  std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  std::__ostream_insert<char,std::char_traits<char>>(pSVar3->m_streams[pSVar3->m_verbosity]," |",2);
  pSVar3 = this->spxout;
  poVar6 = (ostream *)pSVar3->m_streams[pSVar3->m_verbosity];
  lVar5 = *(long *)poVar6;
  *(uint *)(poVar6 + *(long *)(lVar5 + -0x18) + 0x18) =
       *(uint *)(poVar6 + *(long *)(lVar5 + -0x18) + 0x18) & 0xfffffefb | 0x100;
  *(undefined8 *)(poVar6 + *(long *)(lVar5 + -0x18) + 8) = 2;
  *(undefined8 *)(poVar6 + *(long *)(lVar5 + -0x18) + 0x10) = 8;
  std::ostream::operator<<
            (poVar6,(this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).iterCount);
  std::__ostream_insert<char,std::char_traits<char>>(pSVar3->m_streams[pSVar3->m_verbosity]," | ",3)
  ;
  *(undefined8 *)
   (pSVar3->m_streams[pSVar3->m_verbosity] +
   *(long *)(*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18) + 0x10) = 5;
  iVar10 = (*((this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).factor)->_vptr_SLinSolver[0xb])();
  std::ostream::operator<<((ostream *)pSVar3->m_streams[pSVar3->m_verbosity],iVar10);
  std::__ostream_insert<char,std::char_traits<char>>(pSVar3->m_streams[pSVar3->m_verbosity]," | ",3)
  ;
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x6d])(&local_68,this);
  boost::multiprecision::operator<<(pSVar3->m_streams[pSVar3->m_verbosity],&local_68);
  std::__ostream_insert<char,std::char_traits<char>>(pSVar3->m_streams[pSVar3->m_verbosity]," | ",3)
  ;
  pnVar1 = &this->m_pricingViol;
  pnVar2 = &this->m_pricingViolCo;
  local_1f8.fpclass = cpp_dec_float_finite;
  local_1f8.prec_elem = 10;
  local_1f8.data._M_elems[0] = 0;
  local_1f8.data._M_elems[1] = 0;
  local_1f8.data._M_elems[2] = 0;
  local_1f8.data._M_elems[3] = 0;
  local_1f8.data._M_elems[4] = 0;
  local_1f8.data._M_elems[5] = 0;
  local_1f8.data._M_elems._24_5_ = 0;
  local_1f8.data._M_elems[7]._1_3_ = 0;
  local_1f8.data._M_elems._32_5_ = 0;
  local_1f8.data._M_elems[9]._1_3_ = 0;
  local_1f8.exp = 0;
  local_1f8.neg = false;
  pcVar13 = &pnVar1->m_backend;
  if ((&local_1f8 != &pnVar2->m_backend) &&
     (pcVar13 = &pnVar2->m_backend, &local_1f8 != &pnVar1->m_backend)) {
    uVar7 = *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 8);
    local_1f8.data._M_elems._32_5_ = SUB85(uVar7,0);
    local_1f8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
    local_1f8.data._M_elems._0_8_ = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
    local_1f8.data._M_elems._8_8_ =
         *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 2);
    local_1f8.data._M_elems._16_8_ =
         *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 4);
    uVar7 = *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 6);
    local_1f8.data._M_elems._24_5_ = SUB85(uVar7,0);
    local_1f8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
    local_1f8.exp = (this->m_pricingViol).m_backend.exp;
    local_1f8.neg = (this->m_pricingViol).m_backend.neg;
    local_1f8.fpclass = (this->m_pricingViol).m_backend.fpclass;
    local_1f8.prec_elem = (this->m_pricingViol).m_backend.prec_elem;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=(&local_1f8,pcVar13);
  if (local_1f8.fpclass == cpp_dec_float_NaN) {
LAB_00234ae7:
    local_238.fpclass = cpp_dec_float_finite;
    local_238.prec_elem = 10;
    local_238.data._M_elems[0] = 0;
    local_238.data._M_elems[1] = 0;
    local_238.data._M_elems[2] = 0;
    local_238.data._M_elems[3] = 0;
    local_238.data._M_elems[4] = 0;
    local_238.data._M_elems[5] = 0;
    local_238.data._M_elems._24_5_ = 0;
    local_238.data._M_elems[7]._1_3_ = 0;
    local_238.data._M_elems._32_5_ = 0;
    local_238.data._M_elems[9]._1_3_ = 0;
    local_238.exp = 0;
    local_238.neg = false;
    pcVar13 = &pnVar1->m_backend;
    if ((&local_238 != &pnVar2->m_backend) &&
       (pcVar13 = &pnVar2->m_backend, &local_238 != &pnVar1->m_backend)) {
      uVar7 = *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 8);
      local_238.data._M_elems._32_5_ = SUB85(uVar7,0);
      local_238.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
      local_238.data._M_elems._0_8_ = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
      local_238.data._M_elems._8_8_ =
           *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 2);
      local_238.data._M_elems._16_8_ =
           *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 4);
      uVar7 = *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 6);
      local_238.data._M_elems._24_5_ = SUB85(uVar7,0);
      local_238.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar7 >> 0x28);
      local_238.exp = (this->m_pricingViol).m_backend.exp;
      local_238.neg = (this->m_pricingViol).m_backend.neg;
      local_238.fpclass = (this->m_pricingViol).m_backend.fpclass;
      local_238.prec_elem = (this->m_pricingViol).m_backend.prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=(&local_238,pcVar13);
  }
  else {
    local_1b8.fpclass = cpp_dec_float_finite;
    local_1b8.prec_elem = 10;
    local_1b8.data._M_elems[0] = 0;
    local_1b8.data._M_elems[1] = 0;
    local_1b8.data._M_elems[2] = 0;
    local_1b8.data._M_elems[3] = 0;
    local_1b8.data._M_elems[4] = 0;
    local_1b8.data._M_elems[5] = 0;
    local_1b8.data._M_elems._24_5_ = 0;
    local_1b8.data._M_elems[7]._1_3_ = 0;
    local_1b8.data._M_elems._32_5_ = 0;
    local_1b8._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_1b8,0.0);
    iVar10 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                       (&local_1f8,&local_1b8);
    if (-1 < iVar10) goto LAB_00234ae7;
    local_238.fpclass = cpp_dec_float_finite;
    local_238.prec_elem = 10;
    local_238.data._M_elems[0] = 0;
    local_238.data._M_elems[1] = 0;
    local_238.data._M_elems[2] = 0;
    local_238.data._M_elems[3] = 0;
    local_238.data._M_elems[4] = 0;
    local_238.data._M_elems[5] = 0;
    local_238.data._M_elems._24_5_ = 0;
    local_238.data._M_elems[7]._1_3_ = 0;
    local_238.data._M_elems._32_5_ = 0;
    local_238.data._M_elems[9]._1_3_ = 0;
    local_238.exp = 0;
    local_238.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_238,0.0);
  }
  boost::multiprecision::operator<<
            (pSVar3->m_streams[pSVar3->m_verbosity],
             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)&local_238);
  std::__ostream_insert<char,std::char_traits<char>>(pSVar3->m_streams[pSVar3->m_verbosity]," | ",3)
  ;
  poVar6 = (ostream *)pSVar3->m_streams[pSVar3->m_verbosity];
  *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 8;
  iVar10 = 0;
  if (0 < this->m_numViol) {
    iVar10 = this->m_numViol;
  }
  std::ostream::operator<<(poVar6,iVar10);
  std::__ostream_insert<char,std::char_traits<char>>(pSVar3->m_streams[pSVar3->m_verbosity]," | ",3)
  ;
  *(undefined8 *)
   (pSVar3->m_streams[pSVar3->m_verbosity] +
   *(long *)(*(long *)pSVar3->m_streams[pSVar3->m_verbosity] + -0x18) + 8) = 8;
  (*(this->
    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x5e])(&local_a0,this);
  boost::multiprecision::operator<<(pSVar3->m_streams[pSVar3->m_verbosity],&local_a0);
  iVar10 = this->printBasisMetric;
  if (iVar10 == 0) {
    pSVar3 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar3->m_streams[pSVar3->m_verbosity]," | ",3);
    poVar4 = pSVar3->m_streams[pSVar3->m_verbosity];
    lVar5 = *(long *)poVar4;
    lVar8 = *(long *)(lVar5 + -0x18);
    *(uint *)(poVar4 + lVar8 + 0x18) = *(uint *)(poVar4 + lVar8 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 8) = 2;
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x68])(&local_d8,this,0);
    boost::multiprecision::operator<<(pSVar3->m_streams[pSVar3->m_verbosity],&local_d8);
    iVar10 = this->printBasisMetric;
  }
  if (iVar10 == 1) {
    pSVar3 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar3->m_streams[pSVar3->m_verbosity]," | ",3);
    poVar4 = pSVar3->m_streams[pSVar3->m_verbosity];
    lVar5 = *(long *)poVar4;
    lVar8 = *(long *)(lVar5 + -0x18);
    *(uint *)(poVar4 + lVar8 + 0x18) = *(uint *)(poVar4 + lVar8 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 8) = 2;
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x68])(&local_110,this,1);
    boost::multiprecision::operator<<(pSVar3->m_streams[pSVar3->m_verbosity],&local_110);
    iVar10 = this->printBasisMetric;
  }
  if (iVar10 == 2) {
    pSVar3 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar3->m_streams[pSVar3->m_verbosity]," | ",3);
    poVar4 = pSVar3->m_streams[pSVar3->m_verbosity];
    lVar5 = *(long *)poVar4;
    lVar8 = *(long *)(lVar5 + -0x18);
    *(uint *)(poVar4 + lVar8 + 0x18) = *(uint *)(poVar4 + lVar8 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 8) = 2;
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x68])(&local_148,this,2);
    boost::multiprecision::operator<<(pSVar3->m_streams[pSVar3->m_verbosity],&local_148);
    iVar10 = this->printBasisMetric;
  }
  if (iVar10 == 3) {
    pSVar3 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar3->m_streams[pSVar3->m_verbosity]," | ",3);
    poVar4 = pSVar3->m_streams[pSVar3->m_verbosity];
    lVar5 = *(long *)poVar4;
    lVar8 = *(long *)(lVar5 + -0x18);
    *(uint *)(poVar4 + lVar8 + 0x18) = *(uint *)(poVar4 + lVar8 + 0x18) & 0xfffffefb | 0x100;
    *(undefined8 *)(poVar4 + *(long *)(lVar5 + -0x18) + 8) = 2;
    local_1b8.fpclass = cpp_dec_float_finite;
    local_1b8.prec_elem = 10;
    local_1b8.data._M_elems[0] = 0;
    local_1b8.data._M_elems[1] = 0;
    local_1b8.data._M_elems[2] = 0;
    local_1b8.data._M_elems[3] = 0;
    local_1b8.data._M_elems[4] = 0;
    local_1b8.data._M_elems[5] = 0;
    local_1b8.data._M_elems._24_5_ = 0;
    local_1b8.data._M_elems[7]._1_3_ = 0;
    local_1b8.data._M_elems._32_5_ = 0;
    local_1b8._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_1b8,1e-06);
    SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::condition(&local_180,
                &this->
                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,0x14,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_1b8);
    boost::multiprecision::operator<<(pSVar3->m_streams[pSVar3->m_verbosity],&local_180);
  }
  poVar4 = this->spxout->m_streams[this->spxout->m_verbosity];
  cVar9 = (char)poVar4;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + cVar9);
  std::ostream::put(cVar9);
  std::ostream::flush();
LAB_00234ed7:
  this->displayLine = this->displayLine + 1;
  (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_23c);
  return;
}

Assistant:

void SPxSolverBase<R>::printDisplayLine(const bool force, const bool forceHead)
{
   SPX_MSG_INFO1((*this->spxout),

                 if(forceHead || displayLine % (displayFreq * 30) == 0)
{
   (*this->spxout)
            << "type |   time |   iters | facts |    shift | viol sum | viol num | obj value ";

      if(printBasisMetric >= 0)
         (*this->spxout) << " | basis metric";

      (*this->spxout) << std::endl;
   }
   if((force || (displayLine % displayFreq == 0)) && !forceHead)
{
   (type() == LEAVE)
      ? (*this->spxout) << "  L  |" : (*this->spxout) << "  E  |";
      (*this->spxout) << std::fixed << std::setw(7) << std::setprecision(1) << time() << " |";
      (*this->spxout) << std::scientific << std::setprecision(2);
      (*this->spxout) << std::setw(8) << this->iteration() << " | "
                      << std::setw(5) << slinSolver()->getFactorCount() << " | "
                      << shift() << " | "
                      << SOPLEX_MAX(0.0, m_pricingViol + m_pricingViolCo) << " | "
                      << std::setw(8) << SOPLEX_MAX(0, m_numViol) << " | "
                      << std::setprecision(8) << value();

      if(printBasisMetric == 0)
         (*this->spxout) << " | " << std::scientific << std::setprecision(2) << getBasisMetric(0);

      if(printBasisMetric == 1)
         (*this->spxout) << " | " << std::scientific << std::setprecision(2) << getBasisMetric(1);

      if(printBasisMetric == 2)
         (*this->spxout) << " | " << std::scientific << std::setprecision(2) << getBasisMetric(2);

      if(printBasisMetric == 3)
         (*this->spxout) << " | " << std::scientific << std::setprecision(2) <<
                         basis().getEstimatedCondition();

      (*this->spxout) << std::endl;
   }